

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatch __thiscall
QRegularExpressionMatchIterator::peekNext(QRegularExpressionMatchIterator *this)

{
  bool bVar1;
  QMessageLogger *in_RSI;
  QRegularExpressionMatchPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegularExpressionMatch *in_stack_ffffffffffffffa8;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> file;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file.d.ptr = (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)
               (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)in_RDI;
  bVar1 = hasNext((QRegularExpressionMatchIterator *)0x730e5c);
  if (!bVar1) {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)file.d.ptr,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (&local_28,
               "QRegularExpressionMatchIterator::peekNext() called on an iterator already at end");
  }
  QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate> *)0x730e90);
  QRegularExpressionMatch::QRegularExpressionMatch
            ((QRegularExpressionMatch *)in_RDI,in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)file.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpressionMatchIterator::peekNext() const
{
    if (!hasNext())
        qWarning("QRegularExpressionMatchIterator::peekNext() called on an iterator already at end");

    return d->next;
}